

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char *pcVar4;
  size_type sVar5;
  char *pcVar6;
  size_t sVar7;
  size_type sVar8;
  undefined8 uVar9;
  pointer pMVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  undefined4 uVar14;
  bool bVar15;
  undefined7 uVar16;
  int iVar17;
  
  uVar14 = *(undefined4 *)&(param_2->assertionResult).m_info.field_0x34;
  (this->assertionResult).m_info.resultDisposition =
       (param_2->assertionResult).m_info.resultDisposition;
  *(undefined4 *)&(this->assertionResult).m_info.field_0x34 = uVar14;
  pcVar4 = (param_2->assertionResult).m_info.macroName.m_start;
  sVar5 = (param_2->assertionResult).m_info.macroName.m_size;
  pcVar6 = (param_2->assertionResult).m_info.lineInfo.file;
  sVar7 = (param_2->assertionResult).m_info.lineInfo.line;
  sVar8 = (param_2->assertionResult).m_info.capturedExpression.m_size;
  (this->assertionResult).m_info.capturedExpression.m_start =
       (param_2->assertionResult).m_info.capturedExpression.m_start;
  (this->assertionResult).m_info.capturedExpression.m_size = sVar8;
  (this->assertionResult).m_info.lineInfo.file = pcVar6;
  (this->assertionResult).m_info.lineInfo.line = sVar7;
  (this->assertionResult).m_info.macroName.m_start = pcVar4;
  (this->assertionResult).m_info.macroName.m_size = sVar5;
  paVar1 = &(this->assertionResult).m_resultData.message.field_2;
  (this->assertionResult).m_resultData.message._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->assertionResult).m_resultData.message._M_dataplus._M_p;
  paVar2 = &(param_2->assertionResult).m_resultData.message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar9 = *(undefined8 *)((long)&(param_2->assertionResult).m_resultData.message.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->assertionResult).m_resultData.message.field_2 + 8) = uVar9;
  }
  else {
    (this->assertionResult).m_resultData.message._M_dataplus._M_p = pcVar3;
    (this->assertionResult).m_resultData.message.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->assertionResult).m_resultData.message._M_string_length =
       (param_2->assertionResult).m_resultData.message._M_string_length;
  (param_2->assertionResult).m_resultData.message._M_dataplus._M_p = (pointer)paVar2;
  (param_2->assertionResult).m_resultData.message._M_string_length = 0;
  (param_2->assertionResult).m_resultData.message.field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->assertionResult).m_resultData.reconstructedExpression.field_2;
  (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p;
  paVar2 = &(param_2->assertionResult).m_resultData.reconstructedExpression.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar9 = *(undefined8 *)
             ((long)&(param_2->assertionResult).m_resultData.reconstructedExpression.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->assertionResult).m_resultData.reconstructedExpression.field_2 + 8)
         = uVar9;
  }
  else {
    (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p = pcVar3;
    (this->assertionResult).m_resultData.reconstructedExpression.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->assertionResult).m_resultData.reconstructedExpression._M_string_length =
       (param_2->assertionResult).m_resultData.reconstructedExpression._M_string_length;
  (param_2->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2
  ;
  (param_2->assertionResult).m_resultData.reconstructedExpression._M_string_length = 0;
  (param_2->assertionResult).m_resultData.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  (this->assertionResult).m_resultData.resultType =
       (param_2->assertionResult).m_resultData.resultType;
  bVar15 = (param_2->assertionResult).m_resultData.lazyExpression.m_isNegated;
  uVar16 = *(undefined7 *)&(param_2->assertionResult).m_resultData.lazyExpression.field_0x9;
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (param_2->assertionResult).m_resultData.lazyExpression.m_transientExpression;
  (this->assertionResult).m_resultData.lazyExpression.m_isNegated = bVar15;
  *(undefined7 *)&(this->assertionResult).m_resultData.lazyExpression.field_0x9 = uVar16;
  pMVar10 = (param_2->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (this->infoMessages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_2->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->infoMessages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = pMVar10;
  (this->infoMessages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_2->infoMessages).
  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_2->infoMessages).
  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->infoMessages).
  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->totals).testCases.failedButOk = (param_2->totals).testCases.failedButOk;
  iVar17 = (param_2->totals).error;
  uVar14 = *(undefined4 *)&(param_2->totals).field_0x4;
  sVar7 = (param_2->totals).assertions.passed;
  sVar11 = (param_2->totals).assertions.failed;
  sVar12 = (param_2->totals).assertions.failedButOk;
  sVar13 = (param_2->totals).testCases.failed;
  (this->totals).testCases.passed = (param_2->totals).testCases.passed;
  (this->totals).testCases.failed = sVar13;
  (this->totals).assertions.failed = sVar11;
  (this->totals).assertions.failedButOk = sVar12;
  (this->totals).error = iVar17;
  *(undefined4 *)&(this->totals).field_0x4 = uVar14;
  (this->totals).assertions.passed = sVar7;
  return;
}

Assistant:

AssertionResult() = delete;